

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::predict_or_learn_softmax<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  example *peVar1;
  reference ppeVar2;
  score_iterator *in_RDX;
  score_iterator *in_RSI;
  score_iterator *in_RDI;
  float unaff_retaddr;
  v_array<ACTION_SCORE::action_score> *preds;
  multi_ex *in_stack_000004d0;
  action_scores *in_stack_ffffffffffffff88;
  score_iterator *in_stack_ffffffffffffffb0;
  score_iterator *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc3;
  float in_stack_ffffffffffffffc4;
  uint32_t in_stack_ffffffffffffffdc;
  uint64_t in_stack_ffffffffffffffe0;
  score_iterator *pdf_last;
  
  peVar1 = test_adf_sequence(in_stack_000004d0);
  if (peVar1 == (example *)0x0) {
    LEARNER::multiline_learn_or_predict<false>
              ((multi_learner *)in_RSI,(multi_ex *)in_RDX,in_stack_ffffffffffffffe0,
               in_stack_ffffffffffffffdc);
  }
  else {
    LEARNER::multiline_learn_or_predict<true>
              ((multi_learner *)in_RSI,(multi_ex *)in_RDX,in_stack_ffffffffffffffe0,
               in_stack_ffffffffffffffdc);
  }
  ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      ((vector<example_*,_std::allocator<example_*>_> *)in_RDX,0);
  pdf_last = (score_iterator *)&(*ppeVar2)->pred;
  ACTION_SCORE::begin_scores(in_stack_ffffffffffffff88);
  ACTION_SCORE::end_scores(in_stack_ffffffffffffff88);
  ACTION_SCORE::begin_scores(in_stack_ffffffffffffff88);
  ACTION_SCORE::end_scores(in_stack_ffffffffffffff88);
  exploration::generate_softmax<ACTION_SCORE::score_iterator,ACTION_SCORE::score_iterator>
            (unaff_retaddr,in_RDI,in_RSI,in_RDX,pdf_last);
  ACTION_SCORE::begin_scores(in_stack_ffffffffffffff88);
  ACTION_SCORE::end_scores(in_stack_ffffffffffffff88);
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (in_stack_ffffffffffffffc4,(bool)in_stack_ffffffffffffffc3,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void predict_or_learn_softmax(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  if (is_learn && test_adf_sequence(examples) != nullptr)
    multiline_learn_or_predict<true>(base, examples, data.offset);
  else
    multiline_learn_or_predict<false>(base, examples, data.offset);

  v_array<action_score>& preds = examples[0]->pred.a_s;
  generate_softmax(data.lambda, begin_scores(preds), end_scores(preds), begin_scores(preds), end_scores(preds));

  enforce_minimum_probability(data.epsilon, true, begin_scores(preds), end_scores(preds));
}